

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.c
# Opt level: O3

int sprint_dns_answers(char *dest,char *message)

{
  ushort uVar1;
  uint16_t uVar2;
  uint uVar3;
  int iVar4;
  char *pcVar5;
  int j;
  char *pcVar6;
  long lVar7;
  char *pcVar8;
  IP *pIVar9;
  ulong uVar10;
  answer answers [20];
  int local_2c08;
  answer local_2bf8 [20];
  
  uVar3 = read_dns_answers(local_2bf8,message);
  builtin_strncpy(dest,"-------ANSWERS----------\n",0x1a);
  pcVar6 = dest + 0x19;
  if (0 < (int)uVar3) {
    pIVar9 = &local_2bf8[0].address;
    uVar10 = 0;
    do {
      uVar1 = local_2bf8[uVar10].type;
      if (uVar1 < 0xf) {
        if (uVar1 == 1) {
          pcVar5 = "A";
        }
        else if (uVar1 == 5) {
          pcVar5 = "CNAME";
        }
        else {
LAB_0010447a:
          pcVar5 = "Unknow";
        }
      }
      else if (uVar1 == 0xf) {
        pcVar5 = "MX";
      }
      else {
        pcVar5 = "AAAA";
        if (uVar1 != 0x1c) goto LAB_0010447a;
      }
      pcVar8 = "Unknow";
      if (local_2bf8[uVar10].class_ == 1) {
        pcVar8 = "IN";
      }
      iVar4 = sprintf(pcVar6,"%s type:%s class:%s ttl:%d",local_2bf8 + uVar10,pcVar5,pcVar8,
                      (ulong)local_2bf8[uVar10].ttl);
      pcVar6 = pcVar6 + iVar4;
      uVar2 = local_2bf8[uVar10].type;
      if (uVar2 == 1) {
        pcVar6[2] = '\0';
        pcVar6[0] = 'i';
        pcVar6[1] = 'p';
        pcVar6 = pcVar6 + 2;
        lVar7 = 0;
        do {
          iVar4 = sprintf(pcVar6,":%d",(ulong)*(byte *)((long)&pIVar9->addr + lVar7));
          pcVar6 = pcVar6 + iVar4;
          lVar7 = lVar7 + 1;
        } while (lVar7 != 4);
      }
      else {
        if (uVar2 != 5) {
          if (uVar2 != 0x1c) goto LAB_0010456c;
          lVar7 = 0;
          do {
            iVar4 = sprintf(pcVar6,":%04x",(ulong)*(ushort *)((long)&pIVar9->addr + lVar7 * 2));
            pcVar6 = pcVar6 + iVar4;
            lVar7 = lVar7 + 1;
          } while (lVar7 != 8);
        }
        iVar4 = sprintf(pcVar6,"RRTYPE_CNAME:%s",local_2bf8[uVar10].cname);
        pcVar6 = pcVar6 + iVar4;
      }
LAB_0010456c:
      pcVar6[0] = '\n';
      pcVar6[1] = '\0';
      pcVar6 = pcVar6 + 1;
      uVar10 = uVar10 + 1;
      pIVar9 = (IP *)((long)(pIVar9 + 0x11) + 0x10);
    } while (uVar10 != uVar3);
  }
  local_2c08 = (int)dest;
  return (int)pcVar6 - local_2c08;
}

Assistant:

int sprint_dns_answers(char *dest, char *message) {
  struct answer answers[20];
  char *dest_ = dest;
  int n = read_dns_answers(answers, message);
  dest += sprintf(dest, "-------ANSWERS----------\n");
  for (int i = 0; i < n; i++) {
    dest += sprintf(dest, "%s type:%s class:%s ttl:%d", answers[i].name,
                    debugstr(DEBUG_PRINT_TYPE_type, answers[i].type),
                    debugstr(DEBUG_PRINT_TYPE_class, answers[i].class_),
                    answers[i].ttl);
    switch (answers[i].type) {
    case RRTYPE_A:
      dest += sprintf(dest, "ip");
      for (int j = 0; j < 4; j++)
        dest += sprintf(dest, ":%d", answers[i].address.addr.v4byte[j]);
      break;
    case RRTYPE_AAAA:
      for (int j = 0; j < 8; j++)
        dest += sprintf(dest, ":%04x", answers[i].address.addr.v6byte[j]);
      ;
    case RRTYPE_CNAME:
      dest += sprintf(dest, "RRTYPE_CNAME:%s", answers[i].cname);
      // free(&answers[i].cname);
    default:
      break;
    }
    dest += sprintf(dest, "\n");
  }
  return dest - dest_;
}